

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O0

void sqlcheck::CheckRecursiveDependency
               (Configuration *state,string *sql_statement,bool *print_statement)

{
  char *pcVar1;
  undefined8 print_statement_00;
  ulong uVar2;
  allocator local_129;
  string local_128;
  string local_108;
  char *local_e8;
  char *message;
  PatternType pattern_type;
  string title;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  regex pattern;
  undefined1 local_40 [8];
  string table_name;
  bool *print_statement_local;
  string *sql_statement_local;
  Configuration *state_local;
  
  table_name.field_2._8_8_ = print_statement;
  GetTableName((string *)local_40,sql_statement);
  uVar2 = std::__cxx11::string::empty();
  pattern._M_automaton.
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_1_ = (uVar2 & 1) != 0;
  if (!pattern._M_automaton.
       super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi._4_1_) {
    std::operator+(&local_a8,"(references\\s+",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::operator+(&local_88,&local_a8,")");
    std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
    basic_regex<std::char_traits<char>,std::allocator<char>>
              ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_68,&local_88,0x10);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&pattern_type,"Recursive Dependency",(allocator *)((long)&message + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&message + 7));
    print_statement_00 = table_name.field_2._8_8_;
    message._0_4_ = 2;
    local_e8 = anon_var_dwarf_8ffcf;
    std::__cxx11::string::string((string *)&local_108,(string *)&pattern_type);
    pcVar1 = local_e8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_128,pcVar1,&local_129);
    CheckPattern(state,sql_statement,(bool *)print_statement_00,(regex *)local_68,RISK_LEVEL_HIGH,
                 PATTERN_TYPE_LOGICAL_DATABASE_DESIGN,&local_108,&local_128,true,0);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&pattern_type);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_68);
  }
  pattern._M_automaton.
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._5_3_ = 0;
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void CheckRecursiveDependency(Configuration& state,
                              const std::string& sql_statement,
                              bool& print_statement){

  std::string table_name = GetTableName(sql_statement);
  if(table_name.empty()){
    return;
  }

  std::regex pattern("(references\\s+" + table_name+ ")");
  std::string title = "Recursive Dependency";
  PatternType pattern_type = PatternType::PATTERN_TYPE_LOGICAL_DATABASE_DESIGN;

  auto message =
      "● Avoid recursive relationships:  "
      "It’s common for data to have recursive relationships. Data may be organized in a "
      "treelike or hierarchical way. However, creating a foreign key constraint to enforce "
      "the relationship between two columns in the same table lends to awkward querying. "
      "Each level of the tree corresponds to another join. You will need to issue recursive "
      "queries to get all descendants or all ancestors of a node. "
      "A solution is to construct an additional closure table. It involves storing all paths "
      "through the tree, not just those with a direct parent-child relationship. "
      "You might want to compare different hierarchical data designs -- closure table, "
      "path enumeration, nested sets -- and pick one based on your application's needs.";

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_HIGH,
               pattern_type,
               title,
               message,
               true);

}